

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1dec.c
# Opt level: O3

int jpc_dec_decodecblks(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  byte *pbVar1;
  ulong *puVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  jpc_dec_tcomp_t *pjVar7;
  jas_matrix_t *pjVar8;
  jpc_mqstate_t *pjVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  jas_matrix_t *pjVar16;
  jpc_dec_seg_t *seg;
  jpc_mqdec_t *pjVar17;
  jpc_bitstream_t *pjVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint_fast32_t uVar25;
  int iVar26;
  int iVar27;
  jpc_dec_rlvl_t *pjVar28;
  ulong uVar29;
  int iVar30;
  jpc_dec_tcomp_t *pjVar31;
  long lVar32;
  jas_seqent_t *pjVar33;
  int iVar34;
  jpc_dec_band_t *pjVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  jpc_dec_prc_t *pjVar40;
  ulong uVar41;
  uint uVar42;
  long lVar43;
  jas_seqent_t *pjVar44;
  jas_seqent_t *pjVar45;
  long lVar46;
  int iVar47;
  int iVar48;
  jpc_dec_cblk_t *pjVar49;
  uint uVar50;
  ulong *puVar51;
  jas_seqent_t *pjVar52;
  bool bVar53;
  long *local_180;
  jas_seqent_t *local_178;
  jas_seqent_t *local_170;
  jas_seqent_t *local_168;
  jas_seqent_t *local_160;
  jas_seqent_t *local_140;
  jas_seqent_t *local_130;
  jas_seqent_t *local_128;
  jas_seqent_t *local_120;
  jas_seqent_t *local_118;
  jas_seqent_t *local_110;
  jas_seqent_t *local_108;
  jas_seqent_t *local_100;
  jas_seqent_t *local_f8;
  jas_seqent_t *local_f0;
  jas_seqent_t *local_e8;
  jas_seqent_t *local_e0;
  jas_seqent_t *local_d8;
  int local_cc;
  int local_b0;
  ulong local_a8;
  
  if (0 < dec->numcomps) {
    pjVar31 = tile->tcomps;
    iVar10 = dec->numcomps;
    do {
      if (0 < (int)pjVar31->numrlvls) {
        pjVar28 = pjVar31->rlvls;
        uVar11 = pjVar31->numrlvls;
        do {
          pjVar35 = pjVar28->bands;
          if ((pjVar35 != (jpc_dec_band_t *)0x0) && (iVar5 = pjVar28->numbands, 0 < iVar5)) {
            do {
              if ((pjVar35->data != (jas_matrix_t *)0x0) && (0 < pjVar28->numprcs)) {
                pjVar40 = pjVar35->prcs;
                iVar12 = pjVar28->numprcs;
                do {
                  pjVar49 = pjVar40->cblks;
                  if ((pjVar49 != (jpc_dec_cblk_t *)0x0) && (iVar6 = pjVar40->numcblks, 0 < iVar6))
                  {
                    do {
                      pjVar7 = tile->tcomps;
                      if (pjVar49->flags == (jas_matrix_t *)0x0) {
                        pjVar16 = jas_matrix_create(pjVar49->data->numrows_ + 2,
                                                    pjVar49->data->numcols_ + 2);
                        pjVar49->flags = pjVar16;
                        if (pjVar16 == (jas_matrix_t *)0x0) {
                          return -1;
                        }
                      }
                      seg = (pjVar49->segs).head;
                      if (seg != (jpc_dec_seg_t *)0x0) {
                        iVar30 = (int)((ulong)((long)pjVar31 - (long)pjVar7) >> 6);
                        while (seg->lyrno < 0x4000) {
                          if (seg->stream == (jas_stream_t *)0x0) {
                            __assert_fail("seg->stream",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                          ,0xd7,
                                          "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                         );
                          }
                          jas_stream_rewind(seg->stream);
                          jas_stream_setrwcount(seg->stream,0);
                          if (seg->type == 2) {
                            if (pjVar49->nulldec == (jpc_bitstream_t *)0x0) {
                              pjVar18 = jpc_bitstream_sopen(seg->stream,"r");
                              pjVar49->nulldec = pjVar18;
                              if (pjVar18 == (jpc_bitstream_t *)0x0) {
                                __assert_fail("0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                              ,0xe7,
                                              "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                             );
                              }
                            }
                          }
                          else {
                            if (seg->type != 1) {
                              __assert_fail("seg->type == JPC_SEG_RAW",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                            ,0xe4,
                                            "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                           );
                            }
                            pjVar17 = pjVar49->mqdec;
                            if (pjVar17 == (jpc_mqdec_t *)0x0) {
                              pjVar17 = jpc_mqdec_create(0x13,(jas_stream_t *)0x0);
                              pjVar49->mqdec = pjVar17;
                              if (pjVar17 == (jpc_mqdec_t *)0x0) {
                                return -1;
                              }
                              jpc_mqdec_setctxs(pjVar17,0x13,jpc_mqctxs);
                              pjVar17 = pjVar49->mqdec;
                            }
                            jpc_mqdec_setinput(pjVar17,seg->stream);
                            jpc_mqdec_init(pjVar49->mqdec);
                          }
                          if (0 < seg->numpasses) {
                            local_cc = 0;
LAB_00128315:
                            iVar27 = pjVar49->numimsbs;
                            iVar38 = pjVar35->numbps;
                            if ((iVar38 < iVar27) &&
                               ((bVar21 = tile->cp->ccps[iVar30].roishift, bVar21 == 0 ||
                                (iVar27 < (int)((uint)bVar21 - iVar38))))) {
                              jas_eprintf("warning: corrupt code stream\n");
                              iVar38 = pjVar35->numbps;
                              iVar27 = pjVar49->numimsbs;
                            }
                            iVar36 = seg->passno + local_cc;
                            uVar22 = ~(((iVar36 - pjVar49->firstpassno) + 2) / 3 + iVar27) +
                                     iVar38 + pjVar35->roishift;
                            if (-1 < (int)uVar22) {
                              if (0x1e < uVar22) {
                                __assert_fail("bpno >= 0 && bpno < 31",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                              ,0x102,
                                              "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                             );
                              }
                              uVar37 = (iVar36 + 2) % 3;
                              bVar21 = (byte)uVar22;
                              if (uVar37 == 2) {
                                if (seg->type != 1) {
                                  __assert_fail("seg->type == JPC_SEG_MQ",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                ,0x117,
                                                "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                               );
                                }
                                pjVar16 = pjVar49->flags;
                                if (pjVar16->numrows_ < 2) {
                                  local_a8 = 0;
                                }
                                else {
                                  local_a8 = (long)pjVar16->rows_[1] - (long)*pjVar16->rows_ >> 3;
                                }
                                pjVar8 = pjVar49->data;
                                if (pjVar8->numrows_ < 2) {
                                  local_b0 = 0;
                                }
                                else {
                                  local_b0 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                }
                                pjVar17 = pjVar49->mqdec;
                                bVar3 = tile->cp->ccps[iVar30].cblkctx;
                                iVar27 = (int)pjVar8->numrows_;
                                if (0 < iVar27) {
                                  uVar22 = (uint)(1 << (bVar21 & 0x1f)) >> 1 | 1 << (uVar22 & 0x1f);
                                  iVar38 = (int)pjVar8->numcols_;
                                  local_168 = *pjVar8->rows_;
                                  local_110 = pjVar16->rows_[1];
                                  pjVar33 = local_110 + 1;
                                  iVar36 = (int)local_a8;
                                  iVar48 = iVar36 * 4;
                                  lVar46 = (long)iVar36;
                                  uVar50 = pjVar35->orient << 8;
                                  uVar42 = -uVar22;
                                  local_a8 = local_a8 & 0xffffffff;
                                  lVar43 = (long)local_b0;
                                  local_e0 = local_110 + lVar46 * 3 + 1;
                                  local_e8 = local_110 + lVar46 * 2 + 1;
                                  local_110 = local_110 + lVar46 + 1;
                                  iVar26 = 0;
                                  do {
                                    iVar13 = iVar27 - iVar26;
                                    iVar23 = 4;
                                    if (iVar13 < 4) {
                                      iVar23 = iVar13;
                                    }
                                    if (0 < iVar38) {
                                      lVar32 = 0;
                                      pjVar44 = local_168;
                                      pjVar45 = pjVar33;
                                      iVar34 = iVar38 + 1;
                                      do {
                                        uVar19 = *(ulong *)((long)pjVar33 + lVar32);
                                        if ((((iVar13 < 4) || ((uVar19 & 0x50ff) != 0)) ||
                                            ((*(ushort *)((long)local_110 + lVar32) & 0x50ff) != 0))
                                           || (((*(ushort *)((long)local_e8 + lVar32) & 0x50ff) != 0
                                               || ((*(ushort *)((long)local_e0 + lVar32) & 0x50ff)
                                                   != 0)))) {
                                          local_180 = (long *)((long)local_168 + lVar32);
                                          puVar51 = (ulong *)((long)pjVar33 + lVar32);
                                          iVar47 = iVar23;
LAB_001286dc:
                                          if ((uVar19 & 0x5000) == 0) {
                                            bVar21 = jpc_zcctxnolut[(uint)uVar19 & 0xff | uVar50];
                                            pjVar17->curctx = pjVar17->ctxs + bVar21;
                                            pjVar9 = pjVar17->ctxs[bVar21];
                                            uVar41 = pjVar9->qeval;
                                            uVar25 = pjVar17->areg - uVar41;
                                            pjVar17->areg = uVar25;
                                            if (pjVar17->creg >> 0x10 < uVar41) {
                                              uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                            }
                                            else {
                                              pjVar17->creg = pjVar17->creg + uVar41 * -0x10000;
                                              if ((short)uVar25 < 0) {
                                                uVar15 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                              }
                                            }
                                            if (uVar15 == 0) {
                                              uVar19 = *puVar51;
                                            }
                                            else {
switchD_0012914c_caseD_0:
                                              uVar41 = uVar19 >> 4 & 0xff;
                                              bVar21 = jpc_scctxnolut[uVar41];
                                              pjVar17->curctx = pjVar17->ctxs + bVar21;
                                              pjVar9 = pjVar17->ctxs[bVar21];
                                              uVar19 = pjVar9->qeval;
                                              uVar25 = pjVar17->areg - uVar19;
                                              pjVar17->areg = uVar25;
                                              if (pjVar17->creg >> 0x10 < uVar19) {
                                                uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                              }
                                              else {
                                                pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                if ((short)uVar25 < 0) {
                                                  uVar15 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                }
                                              }
                                              _Var4 = jpc_spblut[uVar41];
                                              uVar14 = uVar42;
                                              if (uVar15 == _Var4) {
                                                uVar14 = uVar22;
                                              }
                                              *local_180 = (long)(int)uVar14;
                                              if ((bVar3 & 8) == 0) {
                                                *(byte *)(puVar51 + (-1 - local_a8)) =
                                                     (byte)puVar51[-1 - local_a8] | 2;
                                                *(byte *)(puVar51 + (1 - local_a8)) =
                                                     (byte)puVar51[1 - local_a8] | 4;
                                                *(byte *)(puVar51 + (local_a8 - 1)) =
                                                     (byte)puVar51[local_a8 - 1] | 1;
                                                *(byte *)(puVar51 + local_a8 + 1) =
                                                     (byte)puVar51[local_a8 + 1] | 8;
                                                if (uVar15 != _Var4) {
                                                  puVar51[-local_a8] = puVar51[-local_a8] | 0x440;
                                                  uVar19 = puVar51[local_a8];
                                                  goto LAB_001288f6;
                                                }
                                                puVar51[-local_a8] = puVar51[-local_a8] | 0x40;
                                                uVar19 = puVar51[local_a8];
LAB_001288c6:
                                                uVar19 = uVar19 | 0x10;
                                                uVar41 = 0x80;
                                                uVar29 = 0x20;
                                              }
                                              else {
                                                *(byte *)(puVar51 + (local_a8 - 1)) =
                                                     (byte)puVar51[local_a8 - 1] | 1;
                                                *(byte *)(puVar51 + local_a8 + 1) =
                                                     (byte)puVar51[local_a8 + 1] | 8;
                                                uVar19 = puVar51[local_a8];
                                                if (uVar15 == _Var4) goto LAB_001288c6;
LAB_001288f6:
                                                uVar19 = uVar19 | 0x110;
                                                uVar41 = 0x880;
                                                uVar29 = 0x220;
                                              }
                                              puVar51[local_a8] = uVar19;
                                              puVar51[-1] = puVar51[-1] | uVar29;
                                              puVar51[1] = puVar51[1] | uVar41;
                                              uVar19 = *puVar51 | 0x1000;
                                              *puVar51 = uVar19;
                                            }
                                          }
                                          *puVar51 = uVar19 & 0xffffffffffffbfff;
                                          if (1 < iVar47) {
                                            iVar47 = iVar47 + -1;
                                            puVar51 = puVar51 + lVar46;
                                            local_180 = local_180 + lVar43;
                                            uVar19 = *puVar51;
                                            if ((uVar19 & 0x5000) == 0) {
                                              bVar21 = jpc_zcctxnolut[(uint)uVar19 & 0xff | uVar50];
                                              pjVar17->curctx = pjVar17->ctxs + bVar21;
                                              pjVar9 = pjVar17->ctxs[bVar21];
                                              uVar41 = pjVar9->qeval;
                                              uVar25 = pjVar17->areg - uVar41;
                                              pjVar17->areg = uVar25;
                                              if (pjVar17->creg >> 0x10 < uVar41) {
                                                uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                              }
                                              else {
                                                pjVar17->creg = pjVar17->creg + uVar41 * -0x10000;
                                                if ((short)uVar25 < 0) {
                                                  uVar15 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                }
                                              }
                                              if (uVar15 == 0) {
                                                uVar19 = *puVar51;
                                              }
                                              else {
switchD_0012914c_caseD_1:
                                                uVar41 = uVar19 >> 4 & 0xff;
                                                bVar21 = jpc_scctxnolut[uVar41];
                                                pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                pjVar9 = pjVar17->ctxs[bVar21];
                                                uVar19 = pjVar9->qeval;
                                                uVar25 = pjVar17->areg - uVar19;
                                                pjVar17->areg = uVar25;
                                                if (pjVar17->creg >> 0x10 < uVar19) {
                                                  uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                }
                                                else {
                                                  pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                  if ((short)uVar25 < 0) {
                                                    uVar15 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                  }
                                                }
                                                bVar53 = uVar15 != jpc_spblut[uVar41];
                                                uVar15 = uVar42;
                                                if (!bVar53) {
                                                  uVar15 = uVar22;
                                                }
                                                *local_180 = (long)(int)uVar15;
                                                *(byte *)(puVar51 + (-1 - local_a8)) =
                                                     (byte)puVar51[-1 - local_a8] | 2;
                                                *(byte *)(puVar51 + (1 - local_a8)) =
                                                     (byte)puVar51[1 - local_a8] | 4;
                                                *(byte *)(puVar51 + (local_a8 - 1)) =
                                                     (byte)puVar51[local_a8 - 1] | 1;
                                                *(byte *)(puVar51 + local_a8 + 1) =
                                                     (byte)puVar51[local_a8 + 1] | 8;
                                                puVar51[-local_a8] =
                                                     (ulong)bVar53 << 10 | puVar51[-local_a8] | 0x40
                                                ;
                                                puVar51[local_a8] =
                                                     (ulong)bVar53 << 8 | puVar51[local_a8] | 0x10;
                                                puVar51[-1] = (ulong)bVar53 << 9 | puVar51[-1] |
                                                              0x20;
                                                puVar51[1] = (ulong)bVar53 << 0xb | puVar51[1] |
                                                             0x80;
                                                uVar19 = *puVar51 | 0x1000;
                                                *puVar51 = uVar19;
                                              }
                                            }
                                            *puVar51 = uVar19 & 0xffffffffffffbfff;
                                            if (1 < iVar47) {
                                              iVar47 = iVar47 + -1;
                                              puVar51 = puVar51 + lVar46;
                                              local_180 = local_180 + lVar43;
                                              uVar19 = *puVar51;
                                              if ((uVar19 & 0x5000) == 0) {
                                                bVar21 = jpc_zcctxnolut
                                                         [(uint)uVar19 & 0xff | uVar50];
                                                pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                pjVar9 = pjVar17->ctxs[bVar21];
                                                uVar41 = pjVar9->qeval;
                                                uVar25 = pjVar17->areg - uVar41;
                                                pjVar17->areg = uVar25;
                                                if (pjVar17->creg >> 0x10 < uVar41) {
                                                  uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                }
                                                else {
                                                  pjVar17->creg = pjVar17->creg + uVar41 * -0x10000;
                                                  if ((short)uVar25 < 0) {
                                                    uVar15 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                  }
                                                }
                                                if (uVar15 != 0) goto switchD_0012914c_caseD_2;
                                                uVar19 = *puVar51;
                                              }
LAB_00128dc1:
                                              *puVar51 = uVar19 & 0xffffffffffffbfff;
                                              if (1 < iVar47) {
                                                puVar51 = puVar51 + lVar46;
                                                uVar19 = *puVar51;
                                                if ((uVar19 & 0x5000) == 0) {
                                                  bVar21 = jpc_zcctxnolut
                                                           [(uint)uVar19 & 0xff | uVar50];
                                                  pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                  pjVar9 = pjVar17->ctxs[bVar21];
                                                  uVar41 = pjVar9->qeval;
                                                  uVar25 = pjVar17->areg - uVar41;
                                                  pjVar17->areg = uVar25;
                                                  if (pjVar17->creg >> 0x10 < uVar41) {
                                                    uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                  }
                                                  else {
                                                    pjVar17->creg =
                                                         pjVar17->creg + uVar41 * -0x10000;
                                                    if ((short)uVar25 < 0) {
                                                      uVar15 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                    }
                                                  }
                                                  if (uVar15 != 0) {
                                                    local_180 = local_180 + lVar43;
                                                    goto switchD_0012914c_caseD_3;
                                                  }
                                                  uVar19 = *puVar51;
                                                }
                                                goto LAB_00129003;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          pjVar17->curctx = pjVar17->ctxs;
                                          pjVar9 = *pjVar17->ctxs;
                                          uVar19 = pjVar9->qeval;
                                          uVar25 = pjVar17->areg - uVar19;
                                          pjVar17->areg = uVar25;
                                          if (pjVar17->creg >> 0x10 < uVar19) {
                                            uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                          }
                                          else {
                                            pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                            if ((short)uVar25 < 0) {
                                              uVar15 = (uint)pjVar9->mps;
                                            }
                                            else {
                                              uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                            }
                                          }
                                          if (uVar15 != 0) {
                                            pjVar17->curctx = pjVar17->ctxs + 0x12;
                                            pjVar9 = pjVar17->ctxs[0x12];
                                            uVar19 = pjVar9->qeval;
                                            uVar25 = pjVar17->areg - uVar19;
                                            pjVar17->areg = uVar25;
                                            if (pjVar17->creg >> 0x10 < uVar19) {
                                              uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                            }
                                            else {
                                              pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                              if ((short)uVar25 < 0) {
                                                uVar15 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                              }
                                            }
                                            pjVar9 = *pjVar17->curctx;
                                            uVar19 = pjVar9->qeval;
                                            uVar25 = pjVar17->areg - uVar19;
                                            pjVar17->areg = uVar25;
                                            if (pjVar17->creg >> 0x10 < uVar19) {
                                              uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                            }
                                            else {
                                              pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                              if ((short)uVar25 < 0) {
                                                uVar14 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                              }
                                            }
                                            uVar14 = uVar15 * 2 | uVar14;
                                            lVar20 = (long)(int)(uVar14 * iVar36);
                                            uVar19 = *(ulong *)((long)pjVar33 + lVar32 + lVar20 * 8)
                                            ;
                                            iVar47 = iVar23 - uVar14;
                                            if (3 < uVar14) {
                                              puVar51 = (ulong *)(pjVar45 + lVar20);
                                              local_180 = pjVar44 + (int)(uVar14 * local_b0);
                                              goto LAB_001286dc;
                                            }
                                            puVar51 = (ulong *)(lVar32 + lVar20 * 8 + (long)pjVar33)
                                            ;
                                            local_180 = (long *)(lVar32 + (long)(int)(uVar14 * 
                                                  local_b0) * 8 + (long)local_168);
                                            switch(uVar14) {
                                            case 0:
                                              goto switchD_0012914c_caseD_0;
                                            case 1:
                                              goto switchD_0012914c_caseD_1;
                                            case 2:
switchD_0012914c_caseD_2:
                                              uVar41 = uVar19 >> 4 & 0xff;
                                              bVar21 = jpc_scctxnolut[uVar41];
                                              pjVar17->curctx = pjVar17->ctxs + bVar21;
                                              pjVar9 = pjVar17->ctxs[bVar21];
                                              uVar19 = pjVar9->qeval;
                                              uVar25 = pjVar17->areg - uVar19;
                                              pjVar17->areg = uVar25;
                                              if (pjVar17->creg >> 0x10 < uVar19) {
                                                uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                              }
                                              else {
                                                pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                if ((short)uVar25 < 0) {
                                                  uVar15 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                }
                                              }
                                              bVar53 = uVar15 != jpc_spblut[uVar41];
                                              uVar15 = uVar42;
                                              if (!bVar53) {
                                                uVar15 = uVar22;
                                              }
                                              *local_180 = (long)(int)uVar15;
                                              *(byte *)(puVar51 + (-1 - local_a8)) =
                                                   (byte)puVar51[-1 - local_a8] | 2;
                                              *(byte *)(puVar51 + (1 - local_a8)) =
                                                   (byte)puVar51[1 - local_a8] | 4;
                                              *(byte *)(puVar51 + (local_a8 - 1)) =
                                                   (byte)puVar51[local_a8 - 1] | 1;
                                              *(byte *)(puVar51 + local_a8 + 1) =
                                                   (byte)puVar51[local_a8 + 1] | 8;
                                              puVar51[-local_a8] =
                                                   (ulong)bVar53 << 10 | puVar51[-local_a8] | 0x40;
                                              puVar51[local_a8] =
                                                   (ulong)bVar53 << 8 | puVar51[local_a8] | 0x10;
                                              puVar51[-1] = (ulong)bVar53 << 9 | puVar51[-1] | 0x20;
                                              puVar51[1] = (ulong)bVar53 << 0xb | puVar51[1] | 0x80;
                                              uVar19 = *puVar51 | 0x1000;
                                              *puVar51 = uVar19;
                                              goto LAB_00128dc1;
                                            }
switchD_0012914c_caseD_3:
                                            uVar41 = uVar19 >> 4 & 0xff;
                                            bVar21 = jpc_scctxnolut[uVar41];
                                            pjVar17->curctx = pjVar17->ctxs + bVar21;
                                            pjVar9 = pjVar17->ctxs[bVar21];
                                            uVar19 = pjVar9->qeval;
                                            uVar25 = pjVar17->areg - uVar19;
                                            pjVar17->areg = uVar25;
                                            if (pjVar17->creg >> 0x10 < uVar19) {
                                              uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                            }
                                            else {
                                              pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                              if ((short)uVar25 < 0) {
                                                uVar15 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                              }
                                            }
                                            bVar53 = uVar15 != jpc_spblut[uVar41];
                                            uVar15 = uVar42;
                                            if (!bVar53) {
                                              uVar15 = uVar22;
                                            }
                                            *local_180 = (long)(int)uVar15;
                                            *(byte *)(puVar51 + (-1 - local_a8)) =
                                                 (byte)puVar51[-1 - local_a8] | 2;
                                            *(byte *)(puVar51 + (1 - local_a8)) =
                                                 (byte)puVar51[1 - local_a8] | 4;
                                            *(byte *)(puVar51 + (local_a8 - 1)) =
                                                 (byte)puVar51[local_a8 - 1] | 1;
                                            *(byte *)(puVar51 + local_a8 + 1) =
                                                 (byte)puVar51[local_a8 + 1] | 8;
                                            puVar51[-local_a8] =
                                                 (ulong)bVar53 << 10 | puVar51[-local_a8] | 0x40;
                                            puVar51[local_a8] =
                                                 (ulong)bVar53 << 8 | puVar51[local_a8] | 0x10;
                                            puVar51[-1] = (ulong)bVar53 << 9 | puVar51[-1] | 0x20;
                                            puVar51[1] = (ulong)bVar53 << 0xb | puVar51[1] | 0x80;
                                            uVar19 = *puVar51 | 0x1000;
                                            *puVar51 = uVar19;
LAB_00129003:
                                            *puVar51 = uVar19 & 0xffffffffffffbfff;
                                          }
                                        }
                                        pjVar45 = pjVar45 + 1;
                                        pjVar44 = pjVar44 + 1;
                                        lVar32 = lVar32 + 8;
                                        iVar34 = iVar34 + -1;
                                      } while (1 < iVar34);
                                    }
                                    iVar26 = iVar26 + 4;
                                    pjVar33 = pjVar33 + iVar48;
                                    local_168 = local_168 + local_b0 * 4;
                                    local_e0 = local_e0 + iVar48;
                                    local_e8 = local_e8 + iVar48;
                                    local_110 = local_110 + iVar48;
                                  } while (iVar26 < iVar27);
                                }
                                bVar53 = true;
                                if ((bVar3 & 0x20) != 0) {
                                  pjVar17->curctx = pjVar17->ctxs + 0x12;
                                  pjVar9 = pjVar17->ctxs[0x12];
                                  uVar19 = pjVar9->qeval;
                                  uVar25 = pjVar17->areg - uVar19;
                                  pjVar17->areg = uVar25;
                                  if (pjVar17->creg >> 0x10 < uVar19) {
                                    uVar22 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                  }
                                  else {
                                    pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                    if ((short)uVar25 < 0) {
                                      uVar22 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar22 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                    }
                                  }
                                  pjVar9 = *pjVar17->curctx;
                                  uVar19 = pjVar9->qeval;
                                  uVar25 = pjVar17->areg - uVar19;
                                  pjVar17->areg = uVar25;
                                  if (pjVar17->creg >> 0x10 < uVar19) {
                                    uVar42 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                  }
                                  else {
                                    pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                    if ((short)uVar25 < 0) {
                                      uVar42 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar42 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                    }
                                  }
                                  pjVar9 = *pjVar17->curctx;
                                  uVar19 = pjVar9->qeval;
                                  uVar25 = pjVar17->areg - uVar19;
                                  pjVar17->areg = uVar25;
                                  if (pjVar17->creg >> 0x10 < uVar19) {
                                    uVar50 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                  }
                                  else {
                                    pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                    if ((short)uVar25 < 0) {
                                      uVar50 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar50 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                    }
                                  }
                                  pjVar9 = *pjVar17->curctx;
                                  uVar19 = pjVar9->qeval;
                                  uVar25 = pjVar17->areg - uVar19;
                                  pjVar17->areg = uVar25;
                                  if (pjVar17->creg >> 0x10 < uVar19) {
                                    uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                  }
                                  else {
                                    pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                    if ((short)uVar25 < 0) {
                                      uVar15 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                    }
                                  }
                                  if ((uVar15 & 1 |
                                      ((uVar42 & 1) + (uVar22 & 1) * 2) * 4 + (uVar50 & 1) * 2) !=
                                      10) {
                                    jas_eprintf("warning: bad segmentation symbol\n");
                                  }
                                }
                              }
                              else if (uVar37 == 1) {
                                pjVar16 = pjVar49->flags;
                                pjVar8 = pjVar49->data;
                                iVar27 = (int)pjVar8->numcols_;
                                uVar19 = pjVar8->numrows_;
                                if (seg->type == 1) {
                                  if (pjVar16->numrows_ < 2) {
                                    iVar38 = 0;
                                  }
                                  else {
                                    iVar38 = (int)((long)pjVar16->rows_[1] - (long)*pjVar16->rows_
                                                  >> 3);
                                  }
                                  if ((long)uVar19 < 2) {
                                    iVar36 = 0;
                                  }
                                  else {
                                    iVar36 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar53 = true;
                                  if (0 < (int)uVar19) {
                                    pjVar17 = pjVar49->mqdec;
                                    uVar42 = (uint)(1 << (bVar21 & 0x1f)) >> 1;
                                    uVar22 = -(uint)(uVar22 == 0) | -uVar42;
                                    pjVar44 = *pjVar8->rows_;
                                    local_178 = pjVar16->rows_[1];
                                    pjVar33 = local_178 + 1;
                                    lVar43 = (long)iVar38;
                                    iVar38 = iVar38 << 2;
                                    lVar46 = (long)iVar36;
                                    iVar36 = iVar36 << 2;
                                    local_180 = local_178 + lVar43 + 1;
                                    local_140 = local_178 + lVar43 * 2 + 1;
                                    local_178 = local_178 + lVar43 * 3 + 1;
                                    local_130 = pjVar44 + lVar46;
                                    local_118 = pjVar44 + lVar46 * 2;
                                    local_170 = pjVar44 + lVar46 * 3;
                                    do {
                                      uVar50 = (uint)uVar19;
                                      if (0 < iVar27) {
                                        lVar43 = 0;
                                        iVar48 = iVar27 + 1;
                                        do {
                                          uVar15 = (uint)*(ulong *)((long)pjVar33 + lVar43);
                                          if ((uVar15 & 0x5000) == 0x1000) {
                                            bVar21 = jpc_magctxnolut
                                                     [(ulong)(uVar15 >> 2 & 0x800) |
                                                      *(ulong *)((long)pjVar33 + lVar43) & 0xff];
                                            pjVar17->curctx = pjVar17->ctxs + bVar21;
                                            pjVar9 = pjVar17->ctxs[bVar21];
                                            uVar19 = pjVar9->qeval;
                                            uVar25 = pjVar17->areg - uVar19;
                                            pjVar17->areg = uVar25;
                                            if (pjVar17->creg >> 0x10 < uVar19) {
                                              uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                            }
                                            else {
                                              pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                              if ((short)uVar25 < 0) {
                                                uVar15 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                              }
                                            }
                                            uVar14 = uVar22;
                                            if (uVar15 != 0) {
                                              uVar14 = uVar42;
                                            }
                                            uVar15 = -uVar14;
                                            if (-1 < *(long *)((long)pjVar44 + lVar43)) {
                                              uVar15 = uVar14;
                                            }
                                            *(long *)((long)pjVar44 + lVar43) =
                                                 (long)(int)uVar15 +
                                                 *(long *)((long)pjVar44 + lVar43);
                                            pbVar1 = (byte *)((long)pjVar33 + lVar43 + 1);
                                            *pbVar1 = *pbVar1 | 0x20;
                                          }
                                          if (uVar50 != 1) {
                                            uVar15 = (uint)*(ulong *)((long)local_180 + lVar43);
                                            if ((uVar15 & 0x5000) == 0x1000) {
                                              bVar21 = jpc_magctxnolut
                                                       [(ulong)(uVar15 >> 2 & 0x800) |
                                                        *(ulong *)((long)local_180 + lVar43) & 0xff]
                                              ;
                                              pjVar17->curctx = pjVar17->ctxs + bVar21;
                                              pjVar9 = pjVar17->ctxs[bVar21];
                                              uVar19 = pjVar9->qeval;
                                              uVar25 = pjVar17->areg - uVar19;
                                              pjVar17->areg = uVar25;
                                              if (pjVar17->creg >> 0x10 < uVar19) {
                                                uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                              }
                                              else {
                                                pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                if ((short)uVar25 < 0) {
                                                  uVar15 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                }
                                              }
                                              uVar14 = uVar22;
                                              if (uVar15 != 0) {
                                                uVar14 = uVar42;
                                              }
                                              uVar15 = -uVar14;
                                              if (-1 < *(long *)((long)local_130 + lVar43)) {
                                                uVar15 = uVar14;
                                              }
                                              *(long *)((long)local_130 + lVar43) =
                                                   (long)(int)uVar15 +
                                                   *(long *)((long)local_130 + lVar43);
                                              pbVar1 = (byte *)((long)local_180 + lVar43 + 1);
                                              *pbVar1 = *pbVar1 | 0x20;
                                            }
                                            if (2 < uVar50) {
                                              uVar15 = (uint)*(ulong *)((long)local_140 + lVar43);
                                              if ((uVar15 & 0x5000) == 0x1000) {
                                                bVar21 = jpc_magctxnolut
                                                         [(ulong)(uVar15 >> 2 & 0x800) |
                                                          *(ulong *)((long)local_140 + lVar43) &
                                                          0xff];
                                                pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                pjVar9 = pjVar17->ctxs[bVar21];
                                                uVar19 = pjVar9->qeval;
                                                uVar25 = pjVar17->areg - uVar19;
                                                pjVar17->areg = uVar25;
                                                if (pjVar17->creg >> 0x10 < uVar19) {
                                                  uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                }
                                                else {
                                                  pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                  if ((short)uVar25 < 0) {
                                                    uVar15 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                  }
                                                }
                                                uVar14 = uVar22;
                                                if (uVar15 != 0) {
                                                  uVar14 = uVar42;
                                                }
                                                uVar15 = -uVar14;
                                                if (-1 < *(long *)((long)local_118 + lVar43)) {
                                                  uVar15 = uVar14;
                                                }
                                                *(long *)((long)local_118 + lVar43) =
                                                     (long)(int)uVar15 +
                                                     *(long *)((long)local_118 + lVar43);
                                                pbVar1 = (byte *)((long)local_140 + lVar43 + 1);
                                                *pbVar1 = *pbVar1 | 0x20;
                                              }
                                              if (uVar50 != 3) {
                                                uVar15 = (uint)*(ulong *)((long)local_178 + lVar43);
                                                if ((uVar15 & 0x5000) == 0x1000) {
                                                  bVar21 = jpc_magctxnolut
                                                           [(ulong)(uVar15 >> 2 & 0x800) |
                                                            *(ulong *)((long)local_178 + lVar43) &
                                                            0xff];
                                                  pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                  pjVar9 = pjVar17->ctxs[bVar21];
                                                  uVar19 = pjVar9->qeval;
                                                  uVar25 = pjVar17->areg - uVar19;
                                                  pjVar17->areg = uVar25;
                                                  if (pjVar17->creg >> 0x10 < uVar19) {
                                                    uVar15 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                  }
                                                  else {
                                                    pjVar17->creg =
                                                         pjVar17->creg + uVar19 * -0x10000;
                                                    if ((short)uVar25 < 0) {
                                                      uVar15 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar15 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                    }
                                                  }
                                                  uVar14 = uVar22;
                                                  if (uVar15 != 0) {
                                                    uVar14 = uVar42;
                                                  }
                                                  uVar15 = -uVar14;
                                                  if (-1 < *(long *)((long)local_170 + lVar43)) {
                                                    uVar15 = uVar14;
                                                  }
                                                  *(long *)((long)local_170 + lVar43) =
                                                       (long)(int)uVar15 +
                                                       *(long *)((long)local_170 + lVar43);
                                                  pbVar1 = (byte *)((long)local_178 + lVar43 + 1);
                                                  *pbVar1 = *pbVar1 | 0x20;
                                                }
                                              }
                                            }
                                          }
                                          iVar48 = iVar48 + -1;
                                          lVar43 = lVar43 + 8;
                                        } while (1 < iVar48);
                                      }
                                      pjVar33 = pjVar33 + iVar38;
                                      local_180 = local_180 + iVar38;
                                      local_140 = local_140 + iVar38;
                                      local_178 = local_178 + iVar38;
                                      pjVar44 = pjVar44 + iVar36;
                                      local_130 = local_130 + iVar36;
                                      local_118 = local_118 + iVar36;
                                      local_170 = local_170 + iVar36;
                                      uVar19 = (ulong)(uVar50 - 4);
                                    } while (4 < (int)uVar50);
LAB_0012a3cc:
                                    bVar53 = true;
                                  }
                                }
                                else {
                                  if (pjVar16->numrows_ < 2) {
                                    iVar38 = 0;
                                  }
                                  else {
                                    iVar38 = (int)((long)pjVar16->rows_[1] - (long)*pjVar16->rows_
                                                  >> 3);
                                  }
                                  if ((long)uVar19 < 2) {
                                    iVar36 = 0;
                                  }
                                  else {
                                    iVar36 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar53 = true;
                                  if (0 < (int)uVar19) {
                                    pjVar18 = pjVar49->nulldec;
                                    uVar42 = (uint)(1 << (bVar21 & 0x1f)) >> 1;
                                    uVar22 = -(uint)(uVar22 == 0) | -uVar42;
                                    pjVar44 = *pjVar8->rows_;
                                    local_178 = pjVar16->rows_[1];
                                    pjVar33 = local_178 + 1;
                                    lVar43 = (long)iVar38;
                                    iVar38 = iVar38 << 2;
                                    lVar46 = (long)iVar36;
                                    iVar36 = iVar36 << 2;
                                    pjVar45 = local_178 + lVar43 + 1;
                                    local_180 = local_178 + lVar43 * 2 + 1;
                                    local_178 = local_178 + lVar43 * 3 + 1;
                                    local_130 = pjVar44 + lVar46;
                                    local_118 = pjVar44 + lVar46 * 2;
                                    local_170 = pjVar44 + lVar46 * 3;
                                    do {
                                      uVar50 = (uint)uVar19;
                                      if (0 < iVar27) {
                                        lVar43 = 0;
                                        iVar48 = iVar27 + 1;
                                        do {
                                          if ((*(uint *)((long)pjVar33 + lVar43) & 0x5000) == 0x1000
                                             ) {
                                            if ((pjVar18->openmode_ & 1) == 0) {
                                              __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2cd,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                            }
                                            iVar26 = pjVar18->cnt_;
                                            uVar15 = iVar26 - 1;
                                            pjVar18->cnt_ = uVar15;
                                            if (iVar26 < 1) {
                                              uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                              if ((int)uVar15 < 0) goto LAB_0012abbe;
                                            }
                                            else {
                                              uVar15 = (uint)((pjVar18->buf_ >>
                                                               ((ulong)uVar15 & 0x3f) & 1) != 0);
                                            }
                                            uVar14 = uVar22;
                                            if (uVar15 != 0) {
                                              uVar14 = uVar42;
                                            }
                                            lVar46 = -(long)(int)uVar14;
                                            if (-1 < *(long *)((long)pjVar44 + lVar43)) {
                                              lVar46 = (long)(int)uVar14;
                                            }
                                            *(long *)((long)pjVar44 + lVar43) =
                                                 lVar46 + *(long *)((long)pjVar44 + lVar43);
                                            pbVar1 = (byte *)((long)pjVar33 + lVar43 + 1);
                                            *pbVar1 = *pbVar1 | 0x20;
                                          }
                                          if (uVar50 != 1) {
                                            if ((*(uint *)((long)pjVar45 + lVar43) & 0x5000) ==
                                                0x1000) {
                                              if ((pjVar18->openmode_ & 1) == 0) {
                                                __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ"
                                                              ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2d5,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                              }
                                              iVar26 = pjVar18->cnt_;
                                              uVar15 = iVar26 - 1;
                                              pjVar18->cnt_ = uVar15;
                                              if (iVar26 < 1) {
                                                uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                if ((int)uVar15 < 0) goto LAB_0012abbe;
                                              }
                                              else {
                                                uVar15 = (uint)((pjVar18->buf_ >>
                                                                 ((ulong)uVar15 & 0x3f) & 1) != 0);
                                              }
                                              uVar14 = uVar22;
                                              if (uVar15 != 0) {
                                                uVar14 = uVar42;
                                              }
                                              lVar46 = -(long)(int)uVar14;
                                              if (-1 < *(long *)((long)local_130 + lVar43)) {
                                                lVar46 = (long)(int)uVar14;
                                              }
                                              *(long *)((long)local_130 + lVar43) =
                                                   lVar46 + *(long *)((long)local_130 + lVar43);
                                              pbVar1 = (byte *)((long)pjVar45 + lVar43 + 1);
                                              *pbVar1 = *pbVar1 | 0x20;
                                            }
                                            if (2 < uVar50) {
                                              if ((*(uint *)((long)local_180 + lVar43) & 0x5000) ==
                                                  0x1000) {
                                                if ((pjVar18->openmode_ & 1) == 0) {
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2dd,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar26 = pjVar18->cnt_;
                                                uVar15 = iVar26 - 1;
                                                pjVar18->cnt_ = uVar15;
                                                if (iVar26 < 1) {
                                                  uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                  if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                }
                                                else {
                                                  uVar15 = (uint)((pjVar18->buf_ >>
                                                                   ((ulong)uVar15 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                uVar14 = uVar22;
                                                if (uVar15 != 0) {
                                                  uVar14 = uVar42;
                                                }
                                                lVar46 = -(long)(int)uVar14;
                                                if (-1 < *(long *)((long)local_118 + lVar43)) {
                                                  lVar46 = (long)(int)uVar14;
                                                }
                                                *(long *)((long)local_118 + lVar43) =
                                                     lVar46 + *(long *)((long)local_118 + lVar43);
                                                pbVar1 = (byte *)((long)local_180 + lVar43 + 1);
                                                *pbVar1 = *pbVar1 | 0x20;
                                              }
                                              if ((uVar50 != 3) &&
                                                 ((*(uint *)((long)local_178 + lVar43) & 0x5000) ==
                                                  0x1000)) {
                                                if ((pjVar18->openmode_ & 1) == 0) {
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2e5,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar26 = pjVar18->cnt_;
                                                uVar15 = iVar26 - 1;
                                                pjVar18->cnt_ = uVar15;
                                                if (iVar26 < 1) {
                                                  uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                  if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                }
                                                else {
                                                  uVar15 = (uint)((pjVar18->buf_ >>
                                                                   ((ulong)uVar15 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                uVar14 = uVar22;
                                                if (uVar15 != 0) {
                                                  uVar14 = uVar42;
                                                }
                                                lVar46 = -(long)(int)uVar14;
                                                if (-1 < *(long *)((long)local_170 + lVar43)) {
                                                  lVar46 = (long)(int)uVar14;
                                                }
                                                *(long *)((long)local_170 + lVar43) =
                                                     lVar46 + *(long *)((long)local_170 + lVar43);
                                                pbVar1 = (byte *)((long)local_178 + lVar43 + 1);
                                                *pbVar1 = *pbVar1 | 0x20;
                                              }
                                            }
                                          }
                                          iVar48 = iVar48 + -1;
                                          lVar43 = lVar43 + 8;
                                        } while (1 < iVar48);
                                      }
                                      pjVar33 = pjVar33 + iVar38;
                                      pjVar45 = pjVar45 + iVar38;
                                      local_180 = local_180 + iVar38;
                                      local_178 = local_178 + iVar38;
                                      pjVar44 = pjVar44 + iVar36;
                                      local_130 = local_130 + iVar36;
                                      local_118 = local_118 + iVar36;
                                      local_170 = local_170 + iVar36;
                                      uVar19 = (ulong)(uVar50 - 4);
                                    } while (4 < (int)uVar50);
                                    goto LAB_0012a3cc;
                                  }
                                }
                              }
                              else if (uVar37 == 0) {
                                if (seg->type == 1) {
                                  pjVar16 = pjVar49->flags;
                                  if (pjVar16->numrows_ < 2) {
                                    uVar19 = 0;
                                  }
                                  else {
                                    uVar19 = (long)pjVar16->rows_[1] - (long)*pjVar16->rows_ >> 3;
                                  }
                                  pjVar8 = pjVar49->data;
                                  uVar41 = pjVar8->numrows_;
                                  if ((long)uVar41 < 2) {
                                    iVar27 = 0;
                                  }
                                  else {
                                    iVar27 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar53 = true;
                                  if (0 < (int)uVar41) {
                                    bVar3 = tile->cp->ccps[iVar30].cblkctx;
                                    uVar50 = (uint)(1 << (bVar21 & 0x1f)) >> 1 |
                                             1 << (uVar22 & 0x1f);
                                    local_d8 = pjVar16->rows_[1];
                                    uVar29 = uVar19 & 0xffffffff;
                                    lVar43 = (long)(int)uVar19;
                                    pjVar33 = local_d8 + 2;
                                    local_160 = pjVar33 + -uVar29;
                                    local_180 = local_d8 + lVar43 + 2;
                                    local_130 = local_d8 + lVar43 * 2 + 2;
                                    local_128 = local_d8 + lVar43 * 3 + 2;
                                    local_178 = local_d8 + uVar29 + 2;
                                    local_120 = local_d8 + lVar43 + uVar29 + 2;
                                    local_110 = local_d8 + ((lVar43 + 2) - uVar29);
                                    local_f8 = local_d8 + uVar29 + lVar43 * 2 + 2;
                                    local_108 = local_d8 + ((lVar43 * 2 + 2) - uVar29);
                                    local_e8 = local_d8 + uVar29 + lVar43 * 3 + 2;
                                    local_d8 = local_d8 + ((lVar43 * 3 + 2) - uVar29);
                                    iVar38 = (int)pjVar8->numcols_;
                                    local_118 = *pjVar8->rows_;
                                    iVar36 = (int)uVar19 * 4;
                                    uVar42 = pjVar35->orient << 8;
                                    uVar22 = -uVar50;
                                    lVar43 = (long)iVar27;
                                    iVar27 = iVar27 << 2;
                                    local_f0 = local_118 + lVar43;
                                    local_100 = local_118 + lVar43 * 2;
                                    local_e0 = local_118 + lVar43 * 3;
                                    pjVar17 = pjVar49->mqdec;
                                    do {
                                      uVar15 = (uint)uVar41;
                                      if (0 < iVar38) {
                                        lVar43 = 0;
                                        iVar48 = iVar38 + 1;
                                        do {
                                          uVar19 = *(ulong *)((long)pjVar33 + lVar43 + -8);
                                          if ((uVar19 & 0x5000) == 0 && (uVar19 & 0xff) != 0) {
                                            bVar21 = jpc_zcctxnolut[(uint)uVar19 & 0xff | uVar42];
                                            pjVar17->curctx = pjVar17->ctxs + bVar21;
                                            pjVar9 = pjVar17->ctxs[bVar21];
                                            uVar41 = pjVar9->qeval;
                                            uVar25 = pjVar17->areg - uVar41;
                                            pjVar17->areg = uVar25;
                                            if (pjVar17->creg >> 0x10 < uVar41) {
                                              uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                            }
                                            else {
                                              pjVar17->creg = pjVar17->creg + uVar41 * -0x10000;
                                              if ((short)uVar25 < 0) {
                                                uVar14 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                              }
                                            }
                                            if (uVar14 != 0) {
                                              uVar41 = uVar19 >> 4 & 0xff;
                                              bVar21 = jpc_scctxnolut[uVar41];
                                              pjVar17->curctx = pjVar17->ctxs + bVar21;
                                              pjVar9 = pjVar17->ctxs[bVar21];
                                              uVar19 = pjVar9->qeval;
                                              uVar25 = pjVar17->areg - uVar19;
                                              pjVar17->areg = uVar25;
                                              if (pjVar17->creg >> 0x10 < uVar19) {
                                                uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                              }
                                              else {
                                                pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                if ((short)uVar25 < 0) {
                                                  uVar14 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                }
                                              }
                                              uVar24 = (uint)jpc_spblut[uVar41];
                                              if ((bVar3 & 8) == 0) {
                                                pbVar1 = (byte *)((long)local_160 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 2;
                                                *(byte *)((long)local_160 + lVar43) =
                                                     *(byte *)((long)local_160 + lVar43) | 4;
                                                pbVar1 = (byte *)((long)local_178 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_178 + lVar43) =
                                                     *(byte *)((long)local_178 + lVar43) | 8;
                                                uVar19 = *(ulong *)((long)local_160 + lVar43 + -8);
                                                if (uVar14 != uVar24) {
                                                  *(ulong *)((long)local_160 + lVar43 + -8) =
                                                       uVar19 | 0x440;
                                                  uVar19 = *(ulong *)((long)local_178 + lVar43 + -8)
                                                  ;
                                                  goto LAB_00129dc5;
                                                }
                                                *(ulong *)((long)local_160 + lVar43 + -8) =
                                                     uVar19 | 0x40;
                                                uVar19 = *(ulong *)((long)local_178 + lVar43 + -8);
LAB_00129d93:
                                                uVar19 = uVar19 | 0x10;
                                                uVar41 = 0x80;
                                                uVar39 = 0x20;
                                              }
                                              else {
                                                pbVar1 = (byte *)((long)local_178 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_178 + lVar43) =
                                                     *(byte *)((long)local_178 + lVar43) | 8;
                                                uVar19 = *(ulong *)((long)local_178 + lVar43 + -8);
                                                if (uVar14 == uVar24) goto LAB_00129d93;
LAB_00129dc5:
                                                uVar19 = uVar19 | 0x110;
                                                uVar41 = 0x880;
                                                uVar39 = 0x220;
                                              }
                                              *(ulong *)((long)local_178 + lVar43 + -8) = uVar19;
                                              *(ulong *)((long)pjVar33 + lVar43) =
                                                   *(ulong *)((long)pjVar33 + lVar43) | uVar41;
                                              puVar51 = (ulong *)((long)pjVar33 + lVar43 + -0x10);
                                              uVar19 = puVar51[1];
                                              puVar2 = (ulong *)((long)pjVar33 + lVar43 + -0x10);
                                              *puVar2 = (ulong)uVar39 | *puVar51;
                                              puVar2[1] = uVar19 | 0x1000;
                                              uVar39 = uVar22;
                                              if (uVar14 == uVar24) {
                                                uVar39 = uVar50;
                                              }
                                              *(long *)((long)local_118 + lVar43) =
                                                   (long)(int)uVar39;
                                            }
                                            pbVar1 = (byte *)((long)pjVar33 + lVar43 + -7);
                                            *pbVar1 = *pbVar1 | 0x40;
                                          }
                                          if (uVar15 != 1) {
                                            uVar19 = *(ulong *)((long)local_180 + lVar43 + -8);
                                            if ((uVar19 & 0x5000) == 0 && (uVar19 & 0xff) != 0) {
                                              bVar21 = jpc_zcctxnolut[(uint)uVar19 & 0xff | uVar42];
                                              pjVar17->curctx = pjVar17->ctxs + bVar21;
                                              pjVar9 = pjVar17->ctxs[bVar21];
                                              uVar41 = pjVar9->qeval;
                                              uVar25 = pjVar17->areg - uVar41;
                                              pjVar17->areg = uVar25;
                                              if (pjVar17->creg >> 0x10 < uVar41) {
                                                uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                              }
                                              else {
                                                pjVar17->creg = pjVar17->creg + uVar41 * -0x10000;
                                                if ((short)uVar25 < 0) {
                                                  uVar14 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                }
                                              }
                                              if (uVar14 != 0) {
                                                uVar41 = uVar19 >> 4 & 0xff;
                                                bVar21 = jpc_scctxnolut[uVar41];
                                                pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                pjVar9 = pjVar17->ctxs[bVar21];
                                                uVar19 = pjVar9->qeval;
                                                uVar25 = pjVar17->areg - uVar19;
                                                pjVar17->areg = uVar25;
                                                if (pjVar17->creg >> 0x10 < uVar19) {
                                                  uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                }
                                                else {
                                                  pjVar17->creg = pjVar17->creg + uVar19 * -0x10000;
                                                  if ((short)uVar25 < 0) {
                                                    uVar14 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                  }
                                                }
                                                _Var4 = jpc_spblut[uVar41];
                                                puVar51 = (ulong *)((long)local_110 + lVar43 + -0x10
                                                                   );
                                                *puVar51 = *puVar51 | 2;
                                                *(byte *)((long)local_110 + lVar43) =
                                                     *(byte *)((long)local_110 + lVar43) | 4;
                                                pbVar1 = (byte *)((long)local_120 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_120 + lVar43) =
                                                     *(byte *)((long)local_120 + lVar43) | 8;
                                                bVar53 = uVar14 != _Var4;
                                                uVar14 = uVar22;
                                                if (!bVar53) {
                                                  uVar14 = uVar50;
                                                }
                                                *(ulong *)((long)local_110 + lVar43 + -8) =
                                                     (ulong)bVar53 << 10 |
                                                     *(ulong *)((long)local_110 + lVar43 + -8) |
                                                     0x40;
                                                *(ulong *)((long)local_120 + lVar43 + -8) =
                                                     (ulong)bVar53 << 8 |
                                                     *(ulong *)((long)local_120 + lVar43 + -8) |
                                                     0x10;
                                                *(ulong *)((long)local_180 + lVar43) =
                                                     (ulong)bVar53 << 0xb |
                                                     *(ulong *)((long)local_180 + lVar43) | 0x80;
                                                puVar51 = (ulong *)((long)local_180 + lVar43 + -0x10
                                                                   );
                                                uVar19 = puVar51[1];
                                                puVar2 = (ulong *)((long)local_180 + lVar43 + -0x10)
                                                ;
                                                *puVar2 = (ulong)((uint)bVar53 << 9 | 0x20) |
                                                          *puVar51;
                                                puVar2[1] = uVar19 | 0x1000;
                                                *(long *)((long)local_f0 + lVar43) =
                                                     (long)(int)uVar14;
                                              }
                                              pbVar1 = (byte *)((long)local_180 + lVar43 + -7);
                                              *pbVar1 = *pbVar1 | 0x40;
                                            }
                                            if (2 < uVar15) {
                                              uVar19 = *(ulong *)((long)local_130 + lVar43 + -8);
                                              if ((uVar19 & 0x5000) == 0 && (uVar19 & 0xff) != 0) {
                                                bVar21 = jpc_zcctxnolut
                                                         [(uint)uVar19 & 0xff | uVar42];
                                                pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                pjVar9 = pjVar17->ctxs[bVar21];
                                                uVar41 = pjVar9->qeval;
                                                uVar25 = pjVar17->areg - uVar41;
                                                pjVar17->areg = uVar25;
                                                if (pjVar17->creg >> 0x10 < uVar41) {
                                                  uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                }
                                                else {
                                                  pjVar17->creg = pjVar17->creg + uVar41 * -0x10000;
                                                  if ((short)uVar25 < 0) {
                                                    uVar14 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                  }
                                                }
                                                if (uVar14 != 0) {
                                                  uVar41 = uVar19 >> 4 & 0xff;
                                                  bVar21 = jpc_scctxnolut[uVar41];
                                                  pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                  pjVar9 = pjVar17->ctxs[bVar21];
                                                  uVar19 = pjVar9->qeval;
                                                  uVar25 = pjVar17->areg - uVar19;
                                                  pjVar17->areg = uVar25;
                                                  if (pjVar17->creg >> 0x10 < uVar19) {
                                                    uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                  }
                                                  else {
                                                    pjVar17->creg =
                                                         pjVar17->creg + uVar19 * -0x10000;
                                                    if ((short)uVar25 < 0) {
                                                      uVar14 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                    }
                                                  }
                                                  _Var4 = jpc_spblut[uVar41];
                                                  puVar51 = (ulong *)((long)local_108 +
                                                                     lVar43 + -0x10);
                                                  *puVar51 = *puVar51 | 2;
                                                  *(byte *)((long)local_108 + lVar43) =
                                                       *(byte *)((long)local_108 + lVar43) | 4;
                                                  pbVar1 = (byte *)((long)local_f8 + lVar43 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 1;
                                                  *(byte *)((long)local_f8 + lVar43) =
                                                       *(byte *)((long)local_f8 + lVar43) | 8;
                                                  bVar53 = uVar14 != _Var4;
                                                  uVar14 = uVar22;
                                                  if (!bVar53) {
                                                    uVar14 = uVar50;
                                                  }
                                                  *(ulong *)((long)local_108 + lVar43 + -8) =
                                                       (ulong)bVar53 << 10 |
                                                       *(ulong *)((long)local_108 + lVar43 + -8) |
                                                       0x40;
                                                  *(ulong *)((long)local_f8 + lVar43 + -8) =
                                                       (ulong)bVar53 << 8 |
                                                       *(ulong *)((long)local_f8 + lVar43 + -8) |
                                                       0x10;
                                                  *(ulong *)((long)local_130 + lVar43) =
                                                       (ulong)bVar53 << 0xb |
                                                       *(ulong *)((long)local_130 + lVar43) | 0x80;
                                                  puVar51 = (ulong *)((long)local_130 +
                                                                     lVar43 + -0x10);
                                                  uVar19 = puVar51[1];
                                                  puVar2 = (ulong *)((long)local_130 +
                                                                    lVar43 + -0x10);
                                                  *puVar2 = (ulong)((uint)bVar53 << 9 | 0x20) |
                                                            *puVar51;
                                                  puVar2[1] = uVar19 | 0x1000;
                                                  *(long *)((long)local_100 + lVar43) =
                                                       (long)(int)uVar14;
                                                }
                                                pbVar1 = (byte *)((long)local_130 + lVar43 + -7);
                                                *pbVar1 = *pbVar1 | 0x40;
                                              }
                                              if (uVar15 != 3) {
                                                uVar19 = *(ulong *)((long)local_128 + lVar43 + -8);
                                                if ((uVar19 & 0x5000) == 0 && (uVar19 & 0xff) != 0)
                                                {
                                                  bVar21 = jpc_zcctxnolut
                                                           [(uint)uVar19 & 0xff | uVar42];
                                                  pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                  pjVar9 = pjVar17->ctxs[bVar21];
                                                  uVar41 = pjVar9->qeval;
                                                  uVar25 = pjVar17->areg - uVar41;
                                                  pjVar17->areg = uVar25;
                                                  if (pjVar17->creg >> 0x10 < uVar41) {
                                                    uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                  }
                                                  else {
                                                    pjVar17->creg =
                                                         pjVar17->creg + uVar41 * -0x10000;
                                                    if ((short)uVar25 < 0) {
                                                      uVar14 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                    }
                                                  }
                                                  if (uVar14 != 0) {
                                                    uVar41 = uVar19 >> 4 & 0xff;
                                                    bVar21 = jpc_scctxnolut[uVar41];
                                                    pjVar17->curctx = pjVar17->ctxs + bVar21;
                                                    pjVar9 = pjVar17->ctxs[bVar21];
                                                    uVar19 = pjVar9->qeval;
                                                    uVar25 = pjVar17->areg - uVar19;
                                                    pjVar17->areg = uVar25;
                                                    if (pjVar17->creg >> 0x10 < uVar19) {
                                                      uVar14 = jpc_mqdec_lpsexchrenormd(pjVar17);
                                                    }
                                                    else {
                                                      pjVar17->creg =
                                                           pjVar17->creg + uVar19 * -0x10000;
                                                      if ((short)uVar25 < 0) {
                                                        uVar14 = (uint)pjVar9->mps;
                                                      }
                                                      else {
                                                        uVar14 = jpc_mqdec_mpsexchrenormd(pjVar17);
                                                      }
                                                    }
                                                    _Var4 = jpc_spblut[uVar41];
                                                    puVar51 = (ulong *)((long)local_d8 +
                                                                       lVar43 + -0x10);
                                                    *puVar51 = *puVar51 | 2;
                                                    *(byte *)((long)local_d8 + lVar43) =
                                                         *(byte *)((long)local_d8 + lVar43) | 4;
                                                    pbVar1 = (byte *)((long)local_e8 +
                                                                     lVar43 + -0x10);
                                                    *pbVar1 = *pbVar1 | 1;
                                                    *(byte *)((long)local_e8 + lVar43) =
                                                         *(byte *)((long)local_e8 + lVar43) | 8;
                                                    bVar53 = uVar14 != _Var4;
                                                    uVar14 = uVar22;
                                                    if (!bVar53) {
                                                      uVar14 = uVar50;
                                                    }
                                                    *(ulong *)((long)local_d8 + lVar43 + -8) =
                                                         (ulong)bVar53 << 10 |
                                                         *(ulong *)((long)local_d8 + lVar43 + -8) |
                                                         0x40;
                                                    *(ulong *)((long)local_e8 + lVar43 + -8) =
                                                         (ulong)bVar53 << 8 |
                                                         *(ulong *)((long)local_e8 + lVar43 + -8) |
                                                         0x10;
                                                    *(ulong *)((long)local_128 + lVar43) =
                                                         (ulong)bVar53 << 0xb |
                                                         *(ulong *)((long)local_128 + lVar43) | 0x80
                                                    ;
                                                    puVar51 = (ulong *)((long)local_128 +
                                                                       lVar43 + -0x10);
                                                    uVar19 = puVar51[1];
                                                    puVar2 = (ulong *)((long)local_128 +
                                                                      lVar43 + -0x10);
                                                    *puVar2 = (ulong)((uint)bVar53 << 9 | 0x20) |
                                                              *puVar51;
                                                    puVar2[1] = uVar19 | 0x1000;
                                                    *(long *)((long)local_e0 + lVar43) =
                                                         (long)(int)uVar14;
                                                  }
                                                  pbVar1 = (byte *)((long)local_128 + lVar43 + -7);
                                                  *pbVar1 = *pbVar1 | 0x40;
                                                }
                                              }
                                            }
                                          }
                                          iVar48 = iVar48 + -1;
                                          lVar43 = lVar43 + 8;
                                        } while (1 < iVar48);
                                      }
                                      local_118 = local_118 + iVar27;
                                      local_f0 = local_f0 + iVar27;
                                      local_100 = local_100 + iVar27;
                                      local_e0 = local_e0 + iVar27;
                                      pjVar33 = pjVar33 + iVar36;
                                      local_178 = local_178 + iVar36;
                                      local_160 = local_160 + iVar36;
                                      local_180 = local_180 + iVar36;
                                      local_120 = local_120 + iVar36;
                                      local_110 = local_110 + iVar36;
                                      local_130 = local_130 + iVar36;
                                      local_f8 = local_f8 + iVar36;
                                      local_108 = local_108 + iVar36;
                                      local_128 = local_128 + iVar36;
                                      local_e8 = local_e8 + iVar36;
                                      local_d8 = local_d8 + iVar36;
                                      uVar41 = (ulong)(uVar15 - 4);
                                    } while (4 < (int)uVar15);
                                    goto LAB_0012a3cc;
                                  }
                                }
                                else {
                                  pjVar16 = pjVar49->flags;
                                  if (pjVar16->numrows_ < 2) {
                                    uVar19 = 0;
                                  }
                                  else {
                                    uVar19 = (long)pjVar16->rows_[1] - (long)*pjVar16->rows_ >> 3;
                                  }
                                  pjVar8 = pjVar49->data;
                                  uVar41 = pjVar8->numrows_;
                                  if ((long)uVar41 < 2) {
                                    iVar27 = 0;
                                  }
                                  else {
                                    iVar27 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar53 = true;
                                  if (0 < (int)uVar41) {
                                    bVar3 = tile->cp->ccps[iVar30].cblkctx;
                                    uVar22 = (uint)(1 << (bVar21 & 0x1f)) >> 1 |
                                             1 << (uVar22 & 0x1f);
                                    local_100 = pjVar16->rows_[1];
                                    uVar29 = uVar19 & 0xffffffff;
                                    lVar43 = (long)(int)uVar19;
                                    pjVar33 = local_100 + 2;
                                    pjVar44 = pjVar33 + -uVar29;
                                    pjVar52 = local_100 + lVar43 + 2;
                                    local_130 = local_100 + lVar43 * 2 + 2;
                                    local_170 = local_100 + lVar43 * 3 + 2;
                                    pjVar45 = local_100 + uVar29 + 2;
                                    local_128 = local_100 + lVar43 + uVar29 + 2;
                                    local_160 = local_100 + ((lVar43 + 2) - uVar29);
                                    local_110 = local_100 + uVar29 + lVar43 * 2 + 2;
                                    local_f0 = local_100 + ((lVar43 * 2 + 2) - uVar29);
                                    local_108 = local_100 + uVar29 + lVar43 * 3 + 2;
                                    local_100 = local_100 + ((lVar43 * 3 + 2) - uVar29);
                                    iVar38 = (int)pjVar8->numcols_;
                                    local_178 = *pjVar8->rows_;
                                    iVar36 = (int)uVar19 * 4;
                                    uVar42 = -uVar22;
                                    lVar43 = (long)iVar27;
                                    iVar27 = iVar27 << 2;
                                    local_120 = local_178 + lVar43;
                                    local_f8 = local_178 + lVar43 * 2;
                                    local_e8 = local_178 + lVar43 * 3;
                                    pjVar18 = pjVar49->nulldec;
                                    do {
                                      uVar50 = (uint)uVar41;
                                      if (0 < iVar38) {
                                        lVar43 = 0;
                                        iVar48 = iVar38 + 1;
                                        do {
                                          uVar19 = *(ulong *)((long)pjVar33 + lVar43 + -8);
                                          if ((uVar19 & 0x5000) == 0 && (char)uVar19 != '\0') {
                                            if ((pjVar18->openmode_ & 1) == 0) {
LAB_0012aef7:
                                              __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x204,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                            }
                                            iVar26 = pjVar18->cnt_;
                                            uVar15 = iVar26 - 1;
                                            pjVar18->cnt_ = uVar15;
                                            if (iVar26 < 1) {
                                              uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                              if ((int)uVar15 < 0) goto LAB_0012abbe;
                                            }
                                            else {
                                              uVar15 = (uint)((pjVar18->buf_ >>
                                                               ((ulong)uVar15 & 0x3f) & 1) != 0);
                                            }
                                            if (uVar15 != 0) {
                                              if ((pjVar18->openmode_ & 1) == 0) goto LAB_0012aef7;
                                              iVar26 = pjVar18->cnt_;
                                              uVar15 = iVar26 - 1;
                                              pjVar18->cnt_ = uVar15;
                                              if (iVar26 < 1) {
                                                uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                if ((int)uVar15 < 0) goto LAB_0012abbe;
                                              }
                                              else {
                                                uVar15 = (uint)((pjVar18->buf_ >>
                                                                 ((ulong)uVar15 & 0x3f) & 1) != 0);
                                              }
                                              if ((bVar3 & 8) == 0) {
                                                pbVar1 = (byte *)((long)pjVar44 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 2;
                                                *(byte *)((long)pjVar44 + lVar43) =
                                                     *(byte *)((long)pjVar44 + lVar43) | 4;
                                                pbVar1 = (byte *)((long)pjVar45 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)pjVar45 + lVar43) =
                                                     *(byte *)((long)pjVar45 + lVar43) | 8;
                                                uVar19 = *(ulong *)((long)pjVar44 + lVar43 + -8);
                                                if (uVar15 == 0) {
                                                  *(ulong *)((long)pjVar44 + lVar43 + -8) =
                                                       uVar19 | 0x40;
                                                  uVar19 = *(ulong *)((long)pjVar45 + lVar43 + -8);
                                                  goto LAB_0012a6bd;
                                                }
                                                *(ulong *)((long)pjVar44 + lVar43 + -8) =
                                                     uVar19 | 0x440;
                                                uVar19 = *(ulong *)((long)pjVar45 + lVar43 + -8);
LAB_0012a6a3:
                                                uVar19 = uVar19 | 0x110;
                                                uVar41 = 0x880;
                                                uVar14 = 0x220;
                                              }
                                              else {
                                                pbVar1 = (byte *)((long)pjVar45 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)pjVar45 + lVar43) =
                                                     *(byte *)((long)pjVar45 + lVar43) | 8;
                                                uVar19 = *(ulong *)((long)pjVar45 + lVar43 + -8);
                                                if (uVar15 != 0) goto LAB_0012a6a3;
LAB_0012a6bd:
                                                uVar19 = uVar19 | 0x10;
                                                uVar41 = 0x80;
                                                uVar14 = 0x20;
                                              }
                                              *(ulong *)((long)pjVar45 + lVar43 + -8) = uVar19;
                                              *(ulong *)((long)pjVar33 + lVar43) =
                                                   *(ulong *)((long)pjVar33 + lVar43) | uVar41;
                                              puVar51 = (ulong *)((long)pjVar33 + lVar43 + -0x10);
                                              uVar19 = puVar51[1];
                                              puVar2 = (ulong *)((long)pjVar33 + lVar43 + -0x10);
                                              *puVar2 = (ulong)uVar14 | *puVar51;
                                              puVar2[1] = uVar19 | 0x1000;
                                              uVar14 = uVar42;
                                              if (uVar15 == 0) {
                                                uVar14 = uVar22;
                                              }
                                              *(long *)((long)local_178 + lVar43) =
                                                   (long)(int)uVar14;
                                            }
                                            pbVar1 = (byte *)((long)pjVar33 + lVar43 + -7);
                                            *pbVar1 = *pbVar1 | 0x40;
                                          }
                                          if (uVar50 != 1) {
                                            uVar19 = *(ulong *)((long)pjVar52 + lVar43 + -8);
                                            if ((uVar19 & 0x5000) == 0 && (char)uVar19 != '\0') {
                                              if ((pjVar18->openmode_ & 1) == 0) {
LAB_0012af35:
                                                __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ"
                                                              ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x20d,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                              }
                                              iVar26 = pjVar18->cnt_;
                                              uVar15 = iVar26 - 1;
                                              pjVar18->cnt_ = uVar15;
                                              if (iVar26 < 1) {
                                                uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                if ((int)uVar15 < 0) goto LAB_0012abbe;
                                              }
                                              else {
                                                uVar15 = (uint)((pjVar18->buf_ >>
                                                                 ((ulong)uVar15 & 0x3f) & 1) != 0);
                                              }
                                              if (uVar15 != 0) {
                                                if ((pjVar18->openmode_ & 1) == 0)
                                                goto LAB_0012af35;
                                                iVar26 = pjVar18->cnt_;
                                                uVar15 = iVar26 - 1;
                                                pjVar18->cnt_ = uVar15;
                                                if (iVar26 < 1) {
                                                  uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                  if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                }
                                                else {
                                                  uVar15 = (uint)((pjVar18->buf_ >>
                                                                   ((ulong)uVar15 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                pbVar1 = (byte *)((long)local_160 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 2;
                                                *(byte *)((long)local_160 + lVar43) =
                                                     *(byte *)((long)local_160 + lVar43) | 4;
                                                pbVar1 = (byte *)((long)local_128 + lVar43 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_128 + lVar43) =
                                                     *(byte *)((long)local_128 + lVar43) | 8;
                                                bVar53 = uVar15 != 0;
                                                uVar15 = uVar42;
                                                if (!bVar53) {
                                                  uVar15 = uVar22;
                                                }
                                                *(ulong *)((long)local_160 + lVar43 + -8) =
                                                     (ulong)bVar53 << 10 |
                                                     *(ulong *)((long)local_160 + lVar43 + -8) |
                                                     0x40;
                                                *(ulong *)((long)local_128 + lVar43 + -8) =
                                                     (ulong)bVar53 << 8 |
                                                     *(ulong *)((long)local_128 + lVar43 + -8) |
                                                     0x10;
                                                *(ulong *)((long)pjVar52 + lVar43) =
                                                     (ulong)bVar53 << 0xb |
                                                     *(ulong *)((long)pjVar52 + lVar43) | 0x80;
                                                puVar51 = (ulong *)((long)pjVar52 + lVar43 + -0x10);
                                                uVar19 = puVar51[1];
                                                puVar2 = (ulong *)((long)pjVar52 + lVar43 + -0x10);
                                                *puVar2 = (ulong)((uint)bVar53 << 9 | 0x20) |
                                                          *puVar51;
                                                puVar2[1] = uVar19 | 0x1000;
                                                *(long *)((long)local_120 + lVar43) =
                                                     (long)(int)uVar15;
                                              }
                                              pbVar1 = (byte *)((long)pjVar52 + lVar43 + -7);
                                              *pbVar1 = *pbVar1 | 0x40;
                                            }
                                            if (2 < uVar50) {
                                              uVar19 = *(ulong *)((long)local_130 + lVar43 + -8);
                                              if ((uVar19 & 0x5000) == 0 && (char)uVar19 != '\0') {
                                                if ((pjVar18->openmode_ & 1) == 0) {
LAB_0012af92:
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x216,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar26 = pjVar18->cnt_;
                                                uVar15 = iVar26 - 1;
                                                pjVar18->cnt_ = uVar15;
                                                if (iVar26 < 1) {
                                                  uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                  if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                }
                                                else {
                                                  uVar15 = (uint)((pjVar18->buf_ >>
                                                                   ((ulong)uVar15 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if (uVar15 != 0) {
                                                  if ((pjVar18->openmode_ & 1) == 0)
                                                  goto LAB_0012af92;
                                                  iVar26 = pjVar18->cnt_;
                                                  uVar15 = iVar26 - 1;
                                                  pjVar18->cnt_ = uVar15;
                                                  if (iVar26 < 1) {
                                                    uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                    if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                  }
                                                  else {
                                                    uVar15 = (uint)((pjVar18->buf_ >>
                                                                     ((ulong)uVar15 & 0x3f) & 1) !=
                                                                   0);
                                                  }
                                                  pbVar1 = (byte *)((long)local_f0 + lVar43 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 2;
                                                  *(byte *)((long)local_f0 + lVar43) =
                                                       *(byte *)((long)local_f0 + lVar43) | 4;
                                                  pbVar1 = (byte *)((long)local_110 + lVar43 + -0x10
                                                                   );
                                                  *pbVar1 = *pbVar1 | 1;
                                                  *(byte *)((long)local_110 + lVar43) =
                                                       *(byte *)((long)local_110 + lVar43) | 8;
                                                  bVar53 = uVar15 != 0;
                                                  uVar15 = uVar42;
                                                  if (!bVar53) {
                                                    uVar15 = uVar22;
                                                  }
                                                  *(ulong *)((long)local_f0 + lVar43 + -8) =
                                                       (ulong)bVar53 << 10 |
                                                       *(ulong *)((long)local_f0 + lVar43 + -8) |
                                                       0x40;
                                                  *(ulong *)((long)local_110 + lVar43 + -8) =
                                                       (ulong)bVar53 << 8 |
                                                       *(ulong *)((long)local_110 + lVar43 + -8) |
                                                       0x10;
                                                  *(ulong *)((long)local_130 + lVar43) =
                                                       (ulong)bVar53 << 0xb |
                                                       *(ulong *)((long)local_130 + lVar43) | 0x80;
                                                  puVar51 = (ulong *)((long)local_130 +
                                                                     lVar43 + -0x10);
                                                  uVar19 = puVar51[1];
                                                  puVar2 = (ulong *)((long)local_130 +
                                                                    lVar43 + -0x10);
                                                  *puVar2 = (ulong)((uint)bVar53 << 9 | 0x20) |
                                                            *puVar51;
                                                  puVar2[1] = uVar19 | 0x1000;
                                                  *(long *)((long)local_f8 + lVar43) =
                                                       (long)(int)uVar15;
                                                }
                                                pbVar1 = (byte *)((long)local_130 + lVar43 + -7);
                                                *pbVar1 = *pbVar1 | 0x40;
                                              }
                                              if ((uVar50 != 3) &&
                                                 (uVar19 = *(ulong *)((long)local_170 + lVar43 + -8)
                                                 , (uVar19 & 0x5000) == 0 && (char)uVar19 != '\0'))
                                              {
                                                if ((pjVar18->openmode_ & 1) == 0) {
LAB_0012afd0:
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x21f,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar26 = pjVar18->cnt_;
                                                uVar15 = iVar26 - 1;
                                                pjVar18->cnt_ = uVar15;
                                                if (iVar26 < 1) {
                                                  uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                  if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                }
                                                else {
                                                  uVar15 = (uint)((pjVar18->buf_ >>
                                                                   ((ulong)uVar15 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if (uVar15 != 0) {
                                                  if ((pjVar18->openmode_ & 1) == 0)
                                                  goto LAB_0012afd0;
                                                  iVar26 = pjVar18->cnt_;
                                                  uVar15 = iVar26 - 1;
                                                  pjVar18->cnt_ = uVar15;
                                                  if (iVar26 < 1) {
                                                    uVar15 = jpc_bitstream_fillbuf(pjVar18);
                                                    if ((int)uVar15 < 0) goto LAB_0012abbe;
                                                  }
                                                  else {
                                                    uVar15 = (uint)((pjVar18->buf_ >>
                                                                     ((ulong)uVar15 & 0x3f) & 1) !=
                                                                   0);
                                                  }
                                                  pbVar1 = (byte *)((long)local_100 + lVar43 + -0x10
                                                                   );
                                                  *pbVar1 = *pbVar1 | 2;
                                                  *(byte *)((long)local_100 + lVar43) =
                                                       *(byte *)((long)local_100 + lVar43) | 4;
                                                  pbVar1 = (byte *)((long)local_108 + lVar43 + -0x10
                                                                   );
                                                  *pbVar1 = *pbVar1 | 1;
                                                  *(byte *)((long)local_108 + lVar43) =
                                                       *(byte *)((long)local_108 + lVar43) | 8;
                                                  bVar53 = uVar15 != 0;
                                                  uVar15 = uVar42;
                                                  if (!bVar53) {
                                                    uVar15 = uVar22;
                                                  }
                                                  *(ulong *)((long)local_100 + lVar43 + -8) =
                                                       (ulong)bVar53 << 10 |
                                                       *(ulong *)((long)local_100 + lVar43 + -8) |
                                                       0x40;
                                                  *(ulong *)((long)local_108 + lVar43 + -8) =
                                                       (ulong)bVar53 << 8 |
                                                       *(ulong *)((long)local_108 + lVar43 + -8) |
                                                       0x10;
                                                  *(ulong *)((long)local_170 + lVar43) =
                                                       (ulong)bVar53 << 0xb |
                                                       *(ulong *)((long)local_170 + lVar43) | 0x80;
                                                  puVar51 = (ulong *)((long)local_170 +
                                                                     lVar43 + -0x10);
                                                  uVar19 = puVar51[1];
                                                  puVar2 = (ulong *)((long)local_170 +
                                                                    lVar43 + -0x10);
                                                  *puVar2 = (ulong)((uint)bVar53 << 9 | 0x20) |
                                                            *puVar51;
                                                  puVar2[1] = uVar19 | 0x1000;
                                                  *(long *)((long)local_e8 + lVar43) =
                                                       (long)(int)uVar15;
                                                }
                                                pbVar1 = (byte *)((long)local_170 + lVar43 + -7);
                                                *pbVar1 = *pbVar1 | 0x40;
                                              }
                                            }
                                          }
                                          iVar48 = iVar48 + -1;
                                          lVar43 = lVar43 + 8;
                                        } while (1 < iVar48);
                                      }
                                      local_178 = local_178 + iVar27;
                                      local_120 = local_120 + iVar27;
                                      local_f8 = local_f8 + iVar27;
                                      local_e8 = local_e8 + iVar27;
                                      pjVar33 = pjVar33 + iVar36;
                                      pjVar45 = pjVar45 + iVar36;
                                      pjVar44 = pjVar44 + iVar36;
                                      pjVar52 = pjVar52 + iVar36;
                                      local_128 = local_128 + iVar36;
                                      local_160 = local_160 + iVar36;
                                      local_130 = local_130 + iVar36;
                                      local_110 = local_110 + iVar36;
                                      local_f0 = local_f0 + iVar36;
                                      local_170 = local_170 + iVar36;
                                      local_108 = local_108 + iVar36;
                                      local_100 = local_100 + iVar36;
                                      uVar41 = (ulong)(uVar50 - 4);
                                    } while (4 < (int)uVar50);
                                    goto LAB_0012a3cc;
                                  }
                                }
                              }
                              else {
                                bVar53 = false;
                              }
                              goto LAB_0012abd5;
                            }
                            goto LAB_0012ae33;
                          }
LAB_0012ad88:
                          if (seg->type != 1) {
                            if (seg->type != 2) {
                              __assert_fail("seg->type == JPC_SEG_RAW",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                            ,0x131,
                                            "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                           );
                            }
                            bVar53 = (tile->cp->ccps[iVar30].cblkctx & 0x10) == 0;
                            iVar27 = 0x2a;
                            if (bVar53) {
                              iVar27 = 0;
                            }
                            iVar38 = 0x7f;
                            if (bVar53) {
                              iVar38 = 0;
                            }
                            iVar27 = jpc_bitstream_inalign(pjVar49->nulldec,iVar38,iVar27);
                            if (iVar27 < 0) {
                              return -1;
                            }
                            if (iVar27 != 0) {
                              jas_eprintf("warning: bad termination pattern detected\n");
                            }
                            jpc_bitstream_close(pjVar49->nulldec);
                            pjVar49->nulldec = (jpc_bitstream_t *)0x0;
                          }
                          pjVar49->curseg = seg->next;
                          jpc_seglist_remove(&pjVar49->segs,seg);
                          jpc_seg_destroy(seg);
                          seg = pjVar49->curseg;
                          if (seg == (jpc_dec_seg_t *)0x0) break;
                        }
                      }
                      if (pjVar49->curseg != (jpc_dec_seg_t *)0x0) {
                        __assert_fail("dopartial ? (!cblk->curseg) : 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                      ,0x149,
                                      "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                     );
                      }
LAB_0012ae33:
                      pjVar49 = pjVar49 + 1;
                      bVar53 = 1 < iVar6;
                      iVar6 = iVar6 + -1;
                    } while (bVar53);
                  }
                  pjVar40 = pjVar40 + 1;
                  bVar53 = 1 < iVar12;
                  iVar12 = iVar12 + -1;
                } while (bVar53);
              }
              pjVar35 = pjVar35 + 1;
              bVar53 = 1 < iVar5;
              iVar5 = iVar5 + -1;
            } while (bVar53);
          }
          pjVar28 = pjVar28 + 1;
          bVar53 = 1 < (int)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar53);
      }
      pjVar31 = pjVar31 + 1;
      bVar53 = 1 < iVar10;
      iVar10 = iVar10 + -1;
    } while (bVar53);
  }
  return 0;
LAB_0012abbe:
  bVar53 = false;
LAB_0012abd5:
  if ((tile->cp->ccps[iVar30].cblkctx & 2) != 0) {
    jpc_mqdec_setctxs(pjVar49->mqdec,0x13,jpc_mqctxs);
  }
  if (!bVar53) {
    jas_eprintf("coding pass failed passtype=%d segtype=%d\n",(ulong)uVar37,(ulong)(uint)seg->type);
    return -1;
  }
  local_cc = local_cc + 1;
  if (seg->numpasses <= local_cc) goto LAB_0012ad88;
  goto LAB_00128315;
}

Assistant:

int jpc_dec_decodecblks(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compcnt;
	jpc_dec_rlvl_t *rlvl;
	int rlvlcnt;
	jpc_dec_band_t *band;
	int bandcnt;
	jpc_dec_prc_t *prc;
	int prccnt;
	jpc_dec_cblk_t *cblk;
	int cblkcnt;

	for (compcnt = dec->numcomps, tcomp = tile->tcomps; compcnt > 0;
	  --compcnt, ++tcomp) {
		for (rlvlcnt = tcomp->numrlvls, rlvl = tcomp->rlvls;
		  rlvlcnt > 0; --rlvlcnt, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandcnt = rlvl->numbands, band = rlvl->bands;
			  bandcnt > 0; --bandcnt, ++band) {
				if (!band->data) {
					continue;
				}
				for (prccnt = rlvl->numprcs, prc = band->prcs;
				  prccnt > 0; --prccnt, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					for (cblkcnt = prc->numcblks,
					  cblk = prc->cblks; cblkcnt > 0;
					  --cblkcnt, ++cblk) {
						if (jpc_dec_decodecblk(dec, tile, tcomp,
						  band, cblk, 1, JPC_MAXLYRS)) {
							return -1;
						}
					}
				}

			}
		}
	}

	return 0;
}